

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> __thiscall
IRT::CLabelStatement::CastCopy(CLabelStatement *this)

{
  CLabelStatement *this_00;
  long in_RSI;
  CLabel CStack_38;
  
  this_00 = (CLabelStatement *)operator_new(0x28);
  std::__cxx11::string::string((string *)&CStack_38,(string *)(in_RSI + 8));
  CLabelStatement(this_00,&CStack_38);
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode = (_func_int **)this_00;
  std::__cxx11::string::~string((string *)&CStack_38);
  return (__uniq_ptr_data<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CLabelStatement> CLabelStatement::CastCopy( ) const {
    return std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( label )));
}